

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastCallback.cpp
# Opt level: O3

void __thiscall
btTriangleConvexcastCallback::processTriangle
          (btTriangleConvexcastCallback *this,btVector3 *triangle,int partId,int triangleIndex)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  btGjkEpaPenetrationDepthSolver gjkEpaPenetrationSolver;
  btContinuousConvexCollision convexCaster;
  btTriangleShape triangleShape;
  btVoronoiSimplexSolver simplexSolver;
  btConvexPenetrationDepthSolver local_308;
  btContinuousConvexCollision local_300;
  CastResult local_2d0;
  btPolyhedralConvexShape local_210;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  btVoronoiSimplexSolver local_190;
  
  btPolyhedralConvexShape::btPolyhedralConvexShape(&local_210);
  local_210.super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
  _vptr_btCollisionShape = (_func_int **)&PTR__btPolyhedralConvexShape_0021c238;
  local_210.super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.m_shapeType = 1;
  local_1c0 = *(undefined8 *)triangle->m_floats;
  uStack_1b8 = *(undefined8 *)(triangle->m_floats + 2);
  local_1b0 = *(undefined8 *)triangle[1].m_floats;
  uStack_1a8 = *(undefined8 *)(triangle[1].m_floats + 2);
  local_1a0 = *(undefined8 *)triangle[2].m_floats;
  uStack_198 = *(undefined8 *)(triangle[2].m_floats + 2);
  local_210.super_btConvexInternalShape.m_collisionMargin = this->m_triangleCollisionMargin;
  local_190.m_equalVertexThreshold = 0.0001;
  local_190.m_cachedBC.m_usedVertices._0_1_ = 0;
  local_308._vptr_btConvexPenetrationDepthSolver =
       (_func_int **)&PTR__btConvexPenetrationDepthSolver_0021fc08;
  btContinuousConvexCollision::btContinuousConvexCollision
            (&local_300,this->m_convexShape,(btConvexShape *)&local_210,&local_190,&local_308);
  local_2d0._vptr_CastResult = (_func_int **)&PTR_DebugDraw_0021bc78;
  local_2d0.m_debugDrawer = (btIDebugDraw *)0x0;
  local_2d0.m_fraction = 1.0;
  local_2d0.m_allowedPenetration = this->m_allowedPenetration;
  bVar1 = btContinuousConvexCollision::calcTimeOfImpact
                    (&local_300,&this->m_convexShapeFrom,&this->m_convexShapeTo,
                     &this->m_triangleToWorld,&this->m_triangleToWorld,&local_2d0);
  if (bVar1) {
    fVar2 = local_2d0.m_normal.m_floats[0];
    fVar3 = local_2d0.m_normal.m_floats[1];
    fVar4 = local_2d0.m_normal.m_floats[2] * local_2d0.m_normal.m_floats[2] +
            fVar2 * fVar2 + fVar3 * fVar3;
    if ((0.0001 < fVar4) && (local_2d0.m_fraction < this->m_hitFraction)) {
      fVar4 = 1.0 / SQRT(fVar4);
      local_2d0.m_normal.m_floats[2] = local_2d0.m_normal.m_floats[2] * fVar4;
      local_2d0.m_normal.m_floats[0] = fVar2 * fVar4;
      local_2d0.m_normal.m_floats[1] = fVar3 * fVar4;
      (*(this->super_btTriangleCallback)._vptr_btTriangleCallback[3])
                (this,&local_2d0.m_normal,&local_2d0.m_hitPoint,(ulong)(uint)partId,
                 (ulong)(uint)triangleIndex);
    }
  }
  btConvexCast::~btConvexCast(&local_300.super_btConvexCast);
  btPolyhedralConvexShape::~btPolyhedralConvexShape(&local_210);
  return;
}

Assistant:

void
btTriangleConvexcastCallback::processTriangle (btVector3* triangle, int partId, int triangleIndex)
{
	btTriangleShape triangleShape (triangle[0], triangle[1], triangle[2]);
    triangleShape.setMargin(m_triangleCollisionMargin);

	btVoronoiSimplexSolver	simplexSolver;
	btGjkEpaPenetrationDepthSolver	gjkEpaPenetrationSolver;

//#define  USE_SUBSIMPLEX_CONVEX_CAST 1
//if you reenable USE_SUBSIMPLEX_CONVEX_CAST see commented out code below
#ifdef USE_SUBSIMPLEX_CONVEX_CAST
	btSubsimplexConvexCast convexCaster(m_convexShape, &triangleShape, &simplexSolver);
#else
	//btGjkConvexCast	convexCaster(m_convexShape,&triangleShape,&simplexSolver);
	btContinuousConvexCollision convexCaster(m_convexShape,&triangleShape,&simplexSolver,&gjkEpaPenetrationSolver);
#endif //#USE_SUBSIMPLEX_CONVEX_CAST
	
	btConvexCast::CastResult castResult;
	castResult.m_fraction = btScalar(1.);
	castResult.m_allowedPenetration = m_allowedPenetration;
	if (convexCaster.calcTimeOfImpact(m_convexShapeFrom,m_convexShapeTo,m_triangleToWorld, m_triangleToWorld, castResult))
	{
		//add hit
		if (castResult.m_normal.length2() > btScalar(0.0001))
		{					
			if (castResult.m_fraction < m_hitFraction)
			{
/* btContinuousConvexCast's normal is already in world space */
/*
#ifdef USE_SUBSIMPLEX_CONVEX_CAST
				//rotate normal into worldspace
				castResult.m_normal = m_convexShapeFrom.getBasis() * castResult.m_normal;
#endif //USE_SUBSIMPLEX_CONVEX_CAST
*/
				castResult.m_normal.normalize();

				reportHit (castResult.m_normal,
							castResult.m_hitPoint,
							castResult.m_fraction,
							partId,
							triangleIndex);
			}
		}
	}
}